

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringOps.cpp
# Opt level: O2

string * __thiscall
gmlc::utilities::stringOps::getTailString_abi_cxx11_
          (string *__return_storage_ptr__,stringOps *this,string_view input,string_view sep)

{
  size_type sVar1;
  allocator<char> local_39;
  string_view ret;
  string_view input_local;
  
  input_local._M_str = (char *)input._M_len;
  input_local._M_len = (size_t)this;
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                    (&input_local,(char *)sep._M_len,0xffffffffffffffff,(size_type)input._M_str);
  if (sVar1 == 0xffffffffffffffff) {
    ret._M_str = input_local._M_str;
    ret._M_len = input_local._M_len;
  }
  else {
    ret = (string_view)
          CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                    ((basic_string_view<char,_std::char_traits<char>_> *)&input_local,
                     (size_type)(input._M_str + sVar1),0xffffffffffffffff);
  }
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)__return_storage_ptr__,
             (basic_string_view<char,_std::char_traits<char>_> *)&ret,&local_39);
  return __return_storage_ptr__;
}

Assistant:

std::string
        getTailString(std::string_view input, std::string_view sep) noexcept
    {
        auto sepLoc = input.rfind(sep);
        std::string_view ret = (sepLoc == std::string_view::npos) ?
            input :
            input.substr(sepLoc + sep.size());
        return std::string(ret);
    }